

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDEdgePtr __thiscall ON_SubDVertex::CreasedEdge(ON_SubDVertex *this,bool bInteriorEdgesOnly)

{
  bool bVar1;
  ON_SubDEdge *this_00;
  ON_SubDEdge *e;
  ON_SubDEdgePtr OStack_28;
  unsigned_short vei;
  ON_SubDEdgePtr creased_eptr;
  bool bInteriorEdgesOnly_local;
  ON_SubDVertex *this_local;
  
  OStack_28 = (ON_SubDEdgePtr)0;
  if (this->m_edges != (ON_SubDEdgePtr *)0x0) {
    creased_eptr.m_ptr._7_1_ = bInteriorEdgesOnly;
    for (e._6_2_ = 0; e._6_2_ < this->m_edge_count; e._6_2_ = e._6_2_ + 1) {
      this_00 = (ON_SubDEdge *)(this->m_edges[e._6_2_].m_ptr & 0xfffffffffffffff8);
      if ((this_00 != (ON_SubDEdge *)0x0) &&
         ((((creased_eptr.m_ptr._7_1_ & 1) == 0 ||
           (bVar1 = ON_SubDEdge::HasInteriorEdgeTopology(this_00,false), bVar1)) &&
          (this_00->m_edge_tag == Crease)))) {
        bVar1 = ON_SubDEdgePtr::IsNull(&stack0xffffffffffffffd8);
        if (!bVar1) {
          return (ON_SubDEdgePtr)0;
        }
        OStack_28.m_ptr = this->m_edges[e._6_2_].m_ptr;
      }
    }
  }
  return (ON_SubDEdgePtr)OStack_28.m_ptr;
}

Assistant:

const ON_SubDEdgePtr ON_SubDVertex::CreasedEdge(bool bInteriorEdgesOnly) const
{
  ON_SubDEdgePtr creased_eptr = ON_SubDEdgePtr::Null;
  if (nullptr != m_edges)
  {
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
      if (nullptr == e)
        continue;
      if (bInteriorEdgesOnly && false == e->HasInteriorEdgeTopology(false))
        continue;
      if (ON_SubDEdgeTag::Crease == e->m_edge_tag)
      {
        if (creased_eptr.IsNull())
          creased_eptr = m_edges[vei];
        else
          return ON_SubDEdgePtr::Null; // 2 or more creases.
      }
    }
  }
  return creased_eptr;
}